

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_21::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  ostream *poVar1;
  char *in_RSI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,'\x1b');
  std::operator<<(poVar1,in_RSI);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            std::cout << '\033' << _escapeCode;
        }